

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall QGraphicsWidget::setPalette(QWindow *this,QPalette *palette)

{
  QGraphicsWidgetPrivate *this_00;
  QGraphicsWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsWidgetPrivate *d;
  QPalette resolvedPalette;
  QPalette naturalPalette;
  QWindow *in_stack_ffffffffffffffb0;
  QPalette *this_01;
  QPalette *palette_00;
  QGraphicsWidgetPrivate *this_02;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  this_00 = d_func((QGraphicsWidget *)0xa4cf2e);
  QPalette::resolveMask();
  setAttribute(in_stack_ffffffffffffffb0,(WidgetAttribute)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  palette_00 = (QPalette *)local_18;
  QGraphicsWidgetPrivate::naturalWidgetPalette(this_02);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QPalette *)local_28;
  QPalette::resolve((QPalette *)this_01);
  QGraphicsWidgetPrivate::setPalette_helper(this_00,palette_00);
  QPalette::~QPalette(this_01);
  QPalette::~QPalette(palette_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::setPalette(const QPalette &palette)
{
    Q_D(QGraphicsWidget);
    setAttribute(Qt::WA_SetPalette, palette.resolveMask() != 0);

    QPalette naturalPalette = d->naturalWidgetPalette();
    QPalette resolvedPalette = palette.resolve(naturalPalette);
    d->setPalette_helper(resolvedPalette);
}